

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool __thiscall
QHttpHeaders::insert(QHttpHeaders *this,qsizetype i,WellKnownHeader name,QAnyStringView value)

{
  long lVar1;
  QAnyStringView value_00;
  QAnyStringView value_01;
  bool bVar2;
  QHttpHeadersPrivate *pQVar3;
  undefined4 in_EDX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff28;
  WellKnownHeader in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  QList<Header> *this_00;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value_00.m_size._0_4_ = in_stack_ffffffffffffff58;
  value_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)in_stack_ffffffffffffff50;
  value_00.m_size._4_4_ = in_EDX;
  bVar2 = isValidHttpHeaderValueField(value_00);
  if (bVar2) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    pQVar3 = QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c705d);
    this_00 = &pQVar3->headers;
    HeaderName::HeaderName((HeaderName *)0x1c7081,in_stack_ffffffffffffff2c);
    value_01.m_size = in_RDI;
    value_01.field_0.m_data = in_RSI.m_data;
    normalizedValue(value_01);
    QList<Header>::insert
              (this_00,CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    Header::~Header((Header *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QHttpHeaders::insert(qsizetype i, WellKnownHeader name, QAnyStringView value)
{
    verify(i, 0);
    if (!isValidHttpHeaderValueField(value))
        return false;

    d.detach();
    d->headers.insert(i, {HeaderName{name}, normalizedValue(value)});
    return true;
}